

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O1

void __thiscall
cmExtraEclipseCDT4Generator::WriteGroups
          (cmExtraEclipseCDT4Generator *this,
          vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *sourceGroups,string *linkName,
          cmXMLWriter *xml)

{
  pointer ppcVar1;
  cmSourceGroup *pcVar2;
  bool bVar3;
  string *psVar4;
  vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *sourceGroups_00;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *__x;
  pointer pcVar5;
  pointer this_00;
  pointer ppcVar6;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  string linkName3;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> sFiles;
  string linkName4;
  string local_148;
  undefined1 *local_128;
  undefined8 local_120;
  size_type local_118;
  pointer local_110;
  string *local_108;
  string *local_100;
  string local_f8;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> local_d8;
  string local_c0;
  cmExtraEclipseCDT4Generator *local_a0;
  pointer local_98;
  cmSourceGroup *local_90;
  string local_88;
  undefined8 local_68;
  undefined8 local_60;
  undefined1 *local_58;
  undefined1 local_50 [32];
  
  this_00 = (sourceGroups->super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>).
            _M_impl.super__Vector_impl_data._M_start;
  local_98 = (sourceGroups->super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>).
             _M_impl.super__Vector_impl_data._M_finish;
  if (this_00 != local_98) {
    local_100 = linkName;
    local_a0 = this;
    do {
      psVar4 = cmSourceGroup::GetFullName_abi_cxx11_(this_00);
      local_148._M_string_length = (size_type)(local_100->_M_dataplus)._M_p;
      local_148._M_dataplus._M_p = (pointer)local_100->_M_string_length;
      local_148.field_2._M_allocated_capacity = 0;
      local_68 = 0;
      local_60 = 1;
      local_128 = local_50;
      local_50[0] = 0x2f;
      local_148.field_2._8_8_ = 1;
      local_120 = 0;
      local_110 = (psVar4->_M_dataplus)._M_p;
      local_118 = psVar4->_M_string_length;
      local_108 = (string *)0x0;
      views._M_len = 3;
      views._M_array = (iterator)&local_148;
      local_58 = local_128;
      cmCatViews(&local_f8,views);
      if ((pointer)local_f8._M_string_length != (pointer)0x0) {
        pcVar5 = (pointer)0x0;
        do {
          if (local_f8._M_dataplus._M_p[(long)pcVar5] == '\\') {
            local_f8._M_dataplus._M_p[(long)pcVar5] = '/';
          }
          pcVar5 = pcVar5 + 1;
        } while ((pointer)local_f8._M_string_length != pcVar5);
      }
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"virtual:/virtual","");
      AppendLinkedResource(xml,&local_f8,&local_148,VirtualFolder);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
      }
      sourceGroups_00 = cmSourceGroup::GetGroupChildren(this_00);
      if ((sourceGroups_00->super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>).
          _M_impl.super__Vector_impl_data._M_start !=
          (sourceGroups_00->super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>).
          _M_impl.super__Vector_impl_data._M_finish) {
        WriteGroups(local_a0,sourceGroups_00,local_100,xml);
      }
      local_90 = this_00;
      __x = cmSourceGroup::GetSourceFiles(this_00);
      std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::vector
                (&local_d8,__x);
      ppcVar1 = local_d8.
                super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      for (ppcVar6 = local_d8.
                     super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                     ._M_impl.super__Vector_impl_data._M_start; ppcVar6 != ppcVar1;
          ppcVar6 = ppcVar6 + 1) {
        psVar4 = cmSourceFile::GetFullPath_abi_cxx11_(*ppcVar6);
        bVar3 = cmsys::SystemTools::FileIsDirectory(psVar4);
        if (!bVar3) {
          cmsys::SystemTools::GetFilenameName(&local_c0,psVar4);
          local_148._M_dataplus._M_p = (pointer)local_f8._M_string_length;
          local_148._M_string_length = (size_type)local_f8._M_dataplus._M_p;
          local_148.field_2._M_allocated_capacity = 0;
          local_68 = 0;
          local_60 = 1;
          local_128 = local_50;
          local_50[0] = 0x2f;
          local_148.field_2._8_8_ = 1;
          local_120 = 0;
          local_118 = local_c0._M_string_length;
          local_110 = local_c0._M_dataplus._M_p;
          views_00._M_len = 3;
          views_00._M_array = (iterator)&local_148;
          local_108 = &local_c0;
          local_58 = local_128;
          cmCatViews(&local_88,views_00);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
          }
          local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
          pcVar5 = (psVar4->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_148,pcVar5,pcVar5 + psVar4->_M_string_length);
          AppendLinkedResource(xml,&local_88,&local_148,LinkToFile);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != &local_148.field_2) {
            operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
          }
        }
      }
      if (local_d8.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_d8.
                        super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_d8.
                              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_d8.
                              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      pcVar2 = local_90;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      this_00 = pcVar2 + 1;
    } while (this_00 != local_98);
  }
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::WriteGroups(
  std::vector<cmSourceGroup> const& sourceGroups, std::string& linkName,
  cmXMLWriter& xml)
{
  for (cmSourceGroup const& sg : sourceGroups) {
    std::string linkName3 = cmStrCat(linkName, '/', sg.GetFullName());

    std::replace(linkName3.begin(), linkName3.end(), '\\', '/');

    cmExtraEclipseCDT4Generator::AppendLinkedResource(
      xml, linkName3, "virtual:/virtual", VirtualFolder);
    std::vector<cmSourceGroup> const& children = sg.GetGroupChildren();
    if (!children.empty()) {
      this->WriteGroups(children, linkName, xml);
    }
    std::vector<const cmSourceFile*> sFiles = sg.GetSourceFiles();
    for (cmSourceFile const* file : sFiles) {
      std::string const& fullPath = file->GetFullPath();

      if (!cmSystemTools::FileIsDirectory(fullPath)) {
        std::string linkName4 =
          cmStrCat(linkName3, '/', cmSystemTools::GetFilenameName(fullPath));
        cmExtraEclipseCDT4Generator::AppendLinkedResource(
          xml, linkName4,
          cmExtraEclipseCDT4Generator::GetEclipsePath(fullPath), LinkToFile);
      }
    }
  }
}